

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O2

ChLoad<MyLoaderTriangular> * __thiscall
chrono::ChLoad<MyLoaderTriangular>::Clone(ChLoad<MyLoaderTriangular> *this)

{
  ChLoad<MyLoaderTriangular> *this_00;
  
  this_00 = (ChLoad<MyLoaderTriangular> *)operator_new(0x68);
  ChLoadBase::ChLoadBase((ChLoadBase *)this_00,&this->super_ChLoadBase);
  *(undefined ***)this_00 = &PTR__ChLoad_00146100;
  ChLoaderUdistributed::ChLoaderUdistributed
            (&(this_00->loader).super_ChLoaderUdistributed,
             &(this->loader).super_ChLoaderUdistributed);
  (this_00->loader).super_ChLoaderUdistributed.super_ChLoaderU.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderU_001461d0;
  return this_00;
}

Assistant:

virtual ChLoad* Clone() const override { return new ChLoad(*this); }